

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licensecc.cpp
# Opt level: O0

void mergeLicenses(vector<LicenseInfo,_std::allocator<LicenseInfo>_> *licenses,
                  LicenseInfo_conflict *license_out)

{
  uint uVar1;
  bool bVar2;
  pointer paVar3;
  reference paVar4;
  __normal_iterator<const_LicenseInfo_*,_std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>_>
  local_30;
  __normal_iterator<const_LicenseInfo_*,_std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>_>
  local_28;
  const_iterator it;
  int days_left;
  LicenseInfo_conflict *license_out_local;
  vector<LicenseInfo,_std::allocator<LicenseInfo>_> *licenses_local;
  
  if (license_out != (LicenseInfo_conflict *)0x0) {
    it._M_current._4_4_ = 0x80000000;
    local_28._M_current =
         (anon_struct_6488_8_6b9767e4 *)
         std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>::begin(licenses);
    while( true ) {
      local_30._M_current =
           (anon_struct_6488_8_6b9767e4 *)
           std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>::end(licenses);
      bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (!bVar2) break;
      paVar3 = __gnu_cxx::
               __normal_iterator<const_LicenseInfo_*,_std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>_>
               ::operator->(&local_28);
      uVar1 = it._M_current._4_4_;
      if ((paVar3->has_expiry & 1U) == 0) {
        paVar4 = __gnu_cxx::
                 __normal_iterator<const_LicenseInfo_*,_std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>_>
                 ::operator*(&local_28);
        memcpy(license_out,paVar4,0x1958);
        return;
      }
      paVar3 = __gnu_cxx::
               __normal_iterator<const_LicenseInfo_*,_std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>_>
               ::operator->(&local_28);
      if ((int)uVar1 < (int)paVar3->days_left) {
        paVar4 = __gnu_cxx::
                 __normal_iterator<const_LicenseInfo_*,_std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>_>
                 ::operator*(&local_28);
        memcpy(license_out,paVar4,0x1958);
        paVar3 = __gnu_cxx::
                 __normal_iterator<const_LicenseInfo_*,_std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>_>
                 ::operator->(&local_28);
        it._M_current._4_4_ = paVar3->days_left;
      }
      __gnu_cxx::
      __normal_iterator<const_LicenseInfo_*,_std::vector<LicenseInfo,_std::allocator<LicenseInfo>_>_>
      ::operator++(&local_28,0);
    }
  }
  return;
}

Assistant:

static void mergeLicenses(const vector<LicenseInfo>& licenses, LicenseInfo* license_out) {
	if (license_out != nullptr) {
		int days_left = INT_MIN;
		for (auto it = licenses.begin(); it != licenses.end(); it++) {
			// choose the license that expires later...
			if (!it->has_expiry) {
				*license_out = *it;
				break;
			} else if (days_left < (int)it->days_left) {
				*license_out = *it;
				days_left = it->days_left;
			}
		}
	}
}